

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

double __thiscall
opengv::absolute_pose::modules::Epnp::reprojection_error(Epnp *this,double (*R) [3],double *t)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar9 = this->number_of_correspondences;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->uc;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = this->vc;
  dVar15 = 0.0;
  lVar12 = 0;
  pdVar11 = this->pws + 2;
  while ((ulong)(~((int)uVar9 >> 0x1f) & uVar9) << 4 != lVar12) {
    dVar2 = pdVar11[-1];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pdVar11[-2];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *pdVar11;
    pdVar11 = pdVar11 + 3;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = R[2][0];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar2 * R[2][1];
    auVar3 = vfmadd231sd_fma(auVar19,auVar16,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (*R)[0];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar2 * (*R)[1];
    auVar4 = vfmadd231sd_fma(auVar21,auVar16,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = R[1][0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar2 * R[1][1];
    auVar5 = vfmadd231sd_fma(auVar24,auVar16,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = R[2][2];
    auVar3 = vfmadd231sd_fma(auVar3,auVar23,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (*R)[2];
    auVar4 = vfmadd231sd_fma(auVar4,auVar23,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = R[1][2];
    auVar5 = vfmadd231sd_fma(auVar5,auVar23,auVar8);
    lVar10 = lVar12 + 8;
    auVar17._0_8_ = 1.0 / (auVar3._0_8_ + t[2]);
    auVar17._8_8_ = 0x3ff0000000000000;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (auVar5._0_8_ + t[1]) * this->fv;
    auVar3 = vfmadd213sd_fma(auVar25,auVar17,auVar14);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (auVar4._0_8_ + *t) * this->fu;
    auVar4 = vfmadd213sd_fma(auVar22,auVar17,auVar13);
    pdVar1 = (double *)((long)this->us + lVar12);
    lVar12 = lVar12 + 0x10;
    dVar2 = *(double *)((long)this->us + lVar10) - auVar3._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *pdVar1 - auVar4._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar2 * dVar2;
    auVar3 = vfmadd231sd_fma(auVar20,auVar18,auVar18);
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    dVar15 = dVar15 + auVar3._0_8_;
  }
  return dVar15 / (double)(int)uVar9;
}

Assistant:

double
opengv::absolute_pose::modules::Epnp::reprojection_error(
    const double R[3][3],
    const double t[3])
{
  double sum2 = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pw = pws + 3 * i;
    double Xc = dot(R[0], pw) + t[0];
    double Yc = dot(R[1], pw) + t[1];
    double inv_Zc = 1.0 / (dot(R[2], pw) + t[2]);
    double ue = uc + fu * Xc * inv_Zc;
    double ve = vc + fv * Yc * inv_Zc;
    double u = us[2 * i], v = us[2 * i + 1];

    sum2 += sqrt( (u - ue) * (u - ue) + (v - ve) * (v - ve) );
  }

  return sum2 / number_of_correspondences;
}